

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void quternionToCnbMatrix(double q0,double q1,double q2,double q3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double q2q3;
  double q1q3;
  double q1q2;
  double q0q3;
  double q0q2;
  double q0q1;
  double q3q3;
  double q2q2;
  double q1q1;
  double q0q0;
  double q3_local;
  double q2_local;
  double q1_local;
  double q0_local;
  
  mahonyR = (double *)malloc(0x48);
  dVar1 = q0 * q0;
  dVar2 = q1 * q1;
  dVar3 = q2 * q2;
  dVar4 = q3 * q3;
  *mahonyR = ((dVar1 + dVar2) - dVar3) - dVar4;
  mahonyR[1] = (q1 * q2 - q0 * q3) * 2.0;
  mahonyR[2] = (q1 * q3 + q0 * q2) * 2.0;
  mahonyR[3] = (q1 * q2 + q0 * q3) * 2.0;
  mahonyR[4] = ((dVar1 - dVar2) + dVar3) - dVar4;
  mahonyR[5] = (q2 * q3 - q0 * q1) * 2.0;
  mahonyR[6] = (q1 * q3 - q0 * q2) * 2.0;
  mahonyR[7] = (q2 * q3 + q0 * q1) * 2.0;
  mahonyR[8] = ((dVar1 - dVar2) - dVar3) + dVar4;
  return;
}

Assistant:

void quternionToCnbMatrix(double q0, double q1, double q2, double q3) {
    mahonyR = (double *) malloc(sizeof(double) * 9);

    double q0q0 = q0 * q0;
    double q1q1 = q1 * q1;
    double q2q2 = q2 * q2;
    double q3q3 = q3 * q3;
    double q0q1 = q0 * q1;
    double q0q2 = q0 * q2;
    double q0q3 = q0 * q3;
    double q1q2 = q1 * q2;
    double q1q3 = q1 * q3;
    double q2q3 = q2 * q3;
    //定义Cnb
    mahonyR[0] = q0q0 + q1q1 - q2q2 - q3q3;
    mahonyR[1] = 2 * (q1q2 - q0q3);
    mahonyR[2] = 2 * (q1q3 + q0q2);
    mahonyR[3] = 2 * (q1q2 + q0q3);
    mahonyR[4] = q0q0 - q1q1 + q2q2 - q3q3;
    mahonyR[5] = 2 * (q2q3 - q0q1);
    mahonyR[6] = 2 * (q1q3 - q0q2);
    mahonyR[7] = 2 * (q2q3 + q0q1);
    mahonyR[8] = q0q0 - q1q1 - q2q2 + q3q3;
}